

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O3

bool __thiscall
ON_Matrix::BackSolve(ON_Matrix *this,double zero_tolerance,int Bsize,ON_3dPoint *B,ON_3dPoint *X)

{
  double **ppdVar1;
  bool bVar2;
  double ***pppdVar3;
  int iVar4;
  ulong uVar5;
  ON_3dPoint *pOVar6;
  int iVar7;
  ON_3dPoint *p;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  ON_3dPoint *local_90;
  ON_3dPoint *local_88;
  ON_3dPoint local_60;
  ON_3dVector local_48;
  
  iVar7 = this->m_col_count;
  iVar4 = this->m_row_count;
  if ((iVar4 < iVar7) || (iVar4 < Bsize || Bsize < iVar7)) {
LAB_004f2b5f:
    bVar2 = false;
  }
  else {
    if (iVar7 < Bsize) {
      pOVar6 = B + iVar7;
      iVar7 = Bsize - iVar7;
      do {
        dVar10 = ON_3dPoint::MaximumCoordinate(pOVar6);
        if (zero_tolerance < dVar10) goto LAB_004f2b5f;
        pOVar6 = pOVar6 + 1;
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
      iVar4 = this->m_row_count;
    }
    pppdVar3 = &this->m;
    if (iVar4 == (this->m_rowmem).m_count) {
      pppdVar3 = &(this->m_rowmem).m_a;
    }
    ppdVar1 = *pppdVar3;
    iVar7 = this->m_col_count;
    if (X == B) {
      if (iVar7 < 2) {
        return true;
      }
      local_90 = (ON_3dPoint *)(ulong)(iVar7 - 1);
      local_88 = X + (long)local_90;
      uVar8 = (ulong)(iVar7 - 2);
      do {
        if ((long)(uVar8 + 1) < (long)iVar7) {
          pOVar6 = local_90;
          p = local_88;
          do {
            ::operator*(&local_60,ppdVar1[uVar8][(long)pOVar6],p);
            ON_3dVector::ON_3dVector(&local_48,&local_60);
            ON_3dPoint::operator-=(X + uVar8,&local_48);
            pOVar6 = (ON_3dPoint *)((long)pOVar6 + 1);
            iVar7 = this->m_col_count;
            p = p + 1;
          } while ((int)pOVar6 < iVar7);
        }
        local_90 = (ON_3dPoint *)((long)local_90 - 1);
        local_88 = local_88 + -1;
        bVar2 = 0 < (long)uVar8;
        uVar8 = uVar8 - 1;
      } while (bVar2);
    }
    else {
      X[(long)iVar7 + -1].z = B[(long)iVar7 + -1].z;
      dVar10 = B[(long)iVar7 + -1].y;
      X[(long)iVar7 + -1].x = B[(long)iVar7 + -1].x;
      X[(long)iVar7 + -1].y = dVar10;
      iVar7 = this->m_col_count;
      if (iVar7 < 2) {
        return true;
      }
      uVar5 = (ulong)(iVar7 - 1);
      local_90 = X + uVar5;
      uVar8 = (ulong)(iVar7 - 2);
      do {
        X[uVar8].z = B[uVar8].z;
        dVar10 = B[uVar8].y;
        X[uVar8].x = B[uVar8].x;
        X[uVar8].y = dVar10;
        if ((long)(uVar8 + 1) < (long)this->m_col_count) {
          pOVar6 = local_90;
          uVar9 = uVar5;
          do {
            ::operator*(&local_60,ppdVar1[uVar8][uVar9],pOVar6);
            ON_3dVector::ON_3dVector(&local_48,&local_60);
            ON_3dPoint::operator-=(X + uVar8,&local_48);
            uVar9 = uVar9 + 1;
            pOVar6 = pOVar6 + 1;
          } while ((int)uVar9 < this->m_col_count);
        }
        uVar5 = uVar5 - 1;
        local_90 = local_90 + -1;
        bVar2 = 0 < (long)uVar8;
        uVar8 = uVar8 - 1;
      } while (bVar2);
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool
ON_Matrix::BackSolve( 
    double zero_tolerance,
    int Bsize,
    const ON_3dPoint* B,
    ON_3dPoint* X
    ) const
{
  int i, j;

  if ( m_col_count > m_row_count )
    return false; // under determined

  if ( Bsize < m_col_count || Bsize > m_row_count )
    return false; // under determined

  for ( i = m_col_count; i < Bsize; i++ ) {
    if ( B[i].MaximumCoordinate() > zero_tolerance )
      return false; // over determined
  }

  // backsolve
  double const*const* this_m = ThisM();
  if ( X != B )
  {
    X[m_col_count-1] = B[m_col_count-1];
    for ( i = m_col_count-2; i >= 0; i-- ) {
      X[i] = B[i];
      for ( j = i+1; j < m_col_count; j++ ) {
        X[i] -= this_m[i][j]*X[j];
      }
    }
  }
  else {
    for ( i = m_col_count-2; i >= 0; i-- ) {
      for ( j = i+1; j < m_col_count; j++ ) {
        X[i] -= this_m[i][j]*X[j];
      }
    }
  }

  return true;
}